

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_encoder *pjVar1;
  int *piVar2;
  JBLOCKROW paJVar3;
  jpeg_component_info *pjVar4;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  undefined4 uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  _func_void_j_compress_ptr *p_Var16;
  code *pcVar17;
  _func_void_j_compress_ptr *st;
  uint uVar18;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var19;
  ushort uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar12 = *(uint *)&pjVar1[4].start_pass;
    if (uVar12 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar1[4].start_pass + 4));
      uVar12 = cinfo->restart_interval;
      *(uint *)((long)&pjVar1[4].start_pass + 4) =
           *(int *)((long)&pjVar1[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar1[4].start_pass = uVar12 - 1;
  }
  if (cinfo->blocks_in_MCU < 1) {
    return 1;
  }
  piVar2 = cinfo->natural_order;
  lVar8 = 0;
LAB_0010fbe0:
  paJVar3 = MCU_data[lVar8];
  lVar14 = (long)cinfo->MCU_membership[lVar8];
  pjVar4 = cinfo->cur_comp_info[lVar14];
  iVar23 = pjVar4->dc_tbl_no;
  p_Var19 = (&pjVar1[4].encode_mcu)[iVar23] + *(int *)((long)&pjVar1[3].encode_mcu + lVar14 * 4);
  iVar21 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar1[2].finish_pass + lVar14 * 4);
  if (iVar21 == 0) {
    arith_encode(cinfo,(uchar *)p_Var19,0);
    *(undefined4 *)((long)&pjVar1[3].encode_mcu + lVar14 * 4) = 0;
  }
  else {
    *(int *)((long)&pjVar1[2].finish_pass + lVar14 * 4) = (int)(*paJVar3)[0];
    arith_encode(cinfo,(uchar *)p_Var19,1);
    uVar12 = 0;
    bVar5 = iVar21 < 1;
    if (bVar5) {
      iVar21 = -iVar21;
      uVar10 = 8;
      lVar15 = 3;
    }
    else {
      uVar10 = 4;
      lVar15 = 2;
    }
    arith_encode(cinfo,(uchar *)(p_Var19 + 1),(uint)bVar5);
    p_Var19 = p_Var19 + lVar15;
    *(undefined4 *)((long)&pjVar1[3].encode_mcu + lVar14 * 4) = uVar10;
    uVar22 = iVar21 - 1;
    if (uVar22 != 0) {
      uVar12 = 1;
      arith_encode(cinfo,(uchar *)p_Var19,1);
      p_Var19 = (&pjVar1[4].encode_mcu)[iVar23] + 0x14;
      if (uVar22 != 1) {
        uVar12 = 1;
        uVar11 = (ulong)uVar22;
        uVar18 = uVar22;
        do {
          uVar11 = uVar11 >> 1;
          arith_encode(cinfo,(uchar *)p_Var19,1);
          uVar12 = uVar12 * 2;
          p_Var19 = p_Var19 + 1;
          bVar5 = 3 < uVar18;
          uVar18 = (uint)uVar11;
        } while (bVar5);
      }
    }
    iVar21 = 0;
    arith_encode(cinfo,(uchar *)p_Var19,0);
    if ((int)uVar12 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar23] & 0x3f)) >> 1)) {
LAB_0010fd5c:
      *(int *)((long)&pjVar1[3].encode_mcu + lVar14 * 4) = iVar21;
    }
    else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar23] & 0x3f)) >> 1) < (int)uVar12) {
      iVar21 = *(int *)((long)&pjVar1[3].encode_mcu + lVar14 * 4) + 8;
      goto LAB_0010fd5c;
    }
    if (1 < uVar12) {
      do {
        uVar12 = (int)uVar12 >> 1;
        arith_encode(cinfo,(uchar *)(p_Var19 + 0xe),(uint)((uVar12 & uVar22) != 0));
      } while (1 < uVar12);
    }
  }
  iVar23 = cinfo->lim_Se;
  if (iVar23 != 0) {
    lVar15 = (long)iVar23;
    iVar21 = pjVar4->ac_tbl_no;
    piVar9 = piVar2 + lVar15;
    lVar14 = 0;
    do {
      if ((*paJVar3)[*piVar9] != 0) {
        if (lVar15 != lVar14 && -1 < lVar15 - lVar14) {
          iVar13 = 0;
          goto LAB_0010fdef;
        }
        break;
      }
      lVar14 = lVar14 + 1;
      piVar9 = piVar9 + -1;
    } while (lVar15 != lVar14);
    iVar7 = 0;
    goto LAB_0010ffb0;
  }
  goto LAB_0010ffd6;
LAB_0010fdef:
  do {
    p_Var16 = (&pjVar1[9].finish_pass)[iVar21] + iVar13 * 3;
    arith_encode(cinfo,(uchar *)p_Var16,0);
    uVar20 = (*paJVar3)[piVar2[(long)iVar13 + 1]];
    if (uVar20 == 0) {
      piVar9 = piVar2 + (long)iVar13 + 2;
      do {
        arith_encode(cinfo,(uchar *)(p_Var16 + 1),0);
        p_Var16 = p_Var16 + 3;
        uVar20 = (*paJVar3)[*piVar9];
        iVar13 = iVar13 + 1;
        piVar9 = piVar9 + 1;
      } while (uVar20 == 0);
    }
    iVar7 = iVar13 + 1;
    arith_encode(cinfo,(uchar *)(p_Var16 + 1),1);
    uVar6 = -uVar20;
    if (0 < (short)uVar20) {
      uVar6 = uVar20;
    }
    arith_encode(cinfo,(uchar *)(pjVar1 + 0xf),(uint)((short)uVar20 < 1));
    pcVar17 = p_Var16 + 2;
    uVar12 = uVar6 - 1;
    if ((uVar12 == 0) || (arith_encode(cinfo,(uchar *)pcVar17,1), uVar12 == 1)) {
      arith_encode(cinfo,(uchar *)pcVar17,0);
    }
    else {
      arith_encode(cinfo,(uchar *)pcVar17,1);
      lVar15 = 0xd9;
      if (iVar13 < (int)(uint)cinfo->arith_ac_K[iVar21]) {
        lVar15 = 0xbd;
      }
      p_Var16 = (&pjVar1[9].finish_pass)[iVar21] + lVar15;
      uVar22 = (int)uVar12 >> 1;
      if (uVar22 < 2) {
        arith_encode(cinfo,(uchar *)p_Var16,0);
        pcVar17 = p_Var16 + 0xe;
        uVar18 = 2;
      }
      else {
        uVar18 = 2;
        do {
          st = p_Var16;
          arith_encode(cinfo,(uchar *)st,1);
          uVar18 = uVar18 * 2;
          uVar22 = (int)uVar22 >> 1;
          p_Var16 = st + 1;
        } while (1 < uVar22);
        arith_encode(cinfo,(uchar *)(st + 1),0);
        if (uVar18 == 0) goto LAB_0010ff92;
        pcVar17 = st + 0xf;
      }
      do {
        uVar18 = (int)uVar18 >> 1;
        arith_encode(cinfo,(uchar *)pcVar17,(uint)((uVar18 & uVar12) != 0));
      } while (1 < uVar18);
    }
LAB_0010ff92:
    iVar13 = iVar7;
  } while (iVar7 < iVar23 - (int)lVar14);
  iVar23 = cinfo->lim_Se;
LAB_0010ffb0:
  if (iVar7 < iVar23) {
    arith_encode(cinfo,(uchar *)((&pjVar1[9].finish_pass)[iVar21] + iVar7 * 3),1);
  }
LAB_0010ffd6:
  lVar8 = lVar8 + 1;
  if (cinfo->blocks_in_MCU <= lVar8) {
    return 1;
  }
  goto LAB_0010fbe0;
}

Assistant:

METHODDEF(boolean)
encode_mcu (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;	/* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, st + 1, 0);	/* Table F.4: SS = S0 + 1 */
	st += 2;			/* Table F.4: SP = S0 + 2 */
	entropy->dc_context[ci] = 4;	/* small positive diff category */
      } else {
	v = -v;
	arith_encode(cinfo, st + 1, 1);	/* Table F.4: SS = S0 + 1 */
	st += 3;			/* Table F.4: SN = S0 + 3 */
	entropy->dc_context[ci] = 8;	/* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;	/* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] += 8;	/* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    if ((ke = cinfo->lim_Se) == 0) continue;
    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    do {
      if ((*block)[natural_order[ke]]) break;
    } while (--ke);

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 0; k < ke;) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 0);	/* EOB decision */
      while ((v = (*block)[natural_order[++k]]) == 0) {
	arith_encode(cinfo, st + 1, 0);
	st += 3;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
	v = -v;
	arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	if (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (v2 >>= 1) {
	    arith_encode(cinfo, st, 1);
	    m <<= 1;
	    st += 1;
	  }
	}
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k < cinfo->lim_Se */
    if (k < cinfo->lim_Se) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}